

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

uint32_t simd::getSimdSize(SIMDType simdType)

{
  SIMDType simdType_local;
  undefined4 local_4;
  
  if (simdType == avx_function) {
    local_4 = 0x20;
  }
  else if (simdType == sse_function) {
    local_4 = 0x10;
  }
  else if (simdType == neon_function) {
    local_4 = 0x10;
  }
  else if (simdType == cpu_function) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t getSimdSize( SIMDType simdType )
    {
        if ( simdType == avx_function )
            return avx::simdSize;
        if ( simdType == sse_function )
            return sse::simdSize;
        if ( simdType == neon_function )
            return neon::simdSize;
        if ( simdType == cpu_function )
            return 1u;

        return 0u;
    }